

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::lookupTool
          (CAPIBuildSystemFrontendDelegate *this,StringRef name)

{
  pointer __p;
  llb_buildsystem_tool_t *tool;
  llb_data_t cName;
  CAPIBuildSystemFrontendDelegate *this_local;
  StringRef name_local;
  
  cName.length = name.Length;
  cName.data = (uint8_t *)name.Data;
  if (*(long *)(cName.data + 0x70) == 0) {
    std::unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>::
    unique_ptr<std::default_delete<llbuild::buildsystem::Tool>,void>
              ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                *)this,(nullptr_t)0x0);
  }
  else {
    __p = (pointer)(**(code **)(cName.data + 0x70))(*(undefined8 *)(cName.data + 0x38),&tool);
    if (__p == (pointer)0x0) {
      std::unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>::
      unique_ptr<std::default_delete<llbuild::buildsystem::Tool>,void>
                ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                  *)this,(nullptr_t)0x0);
    }
    else {
      std::unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>::
      unique_ptr<std::default_delete<llbuild::buildsystem::Tool>,void>
                ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                  *)this,__p);
    }
  }
  return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Tool> lookupTool(StringRef name) override {
    if (!cAPIDelegate.lookup_tool) {
      return nullptr;
    }
    
    llb_data_t cName{ name.size(), (const uint8_t*) name.data() };
    auto tool = cAPIDelegate.lookup_tool(cAPIDelegate.context, &cName);
    if (!tool) {
      return nullptr;
    }

    return std::unique_ptr<Tool>((Tool*)tool);
  }